

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_alloter.cpp
# Opt level: O3

shared_ptr<cppnet::Alloter> cppnet::MakePoolAlloterPtr(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<cppnet::Alloter> sVar1;
  undefined1 local_29;
  element_type local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  local_28._vptr_Alloter = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cppnet::PoolAlloter,std::allocator<cppnet::PoolAlloter>>
            (a_Stack_20,(PoolAlloter **)&local_28,(allocator<cppnet::PoolAlloter> *)&local_29);
  in_RDI->_vptr_Alloter = local_28._vptr_Alloter;
  in_RDI[1]._vptr_Alloter = (_func_int **)a_Stack_20[0]._M_pi;
  sVar1.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<cppnet::Alloter>)
         sVar1.super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Alloter> MakePoolAlloterPtr() {
    return std::make_shared<cppnet::PoolAlloter>();
}